

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

void __thiscall
HighsLinearSumBounds::add(HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  
  if (this->implVarLowerSource[var] == sum) {
    dVar2 = this->varLower[var];
  }
  else {
    dVar2 = this->varLower[var];
    if (this->varLower[var] <= this->implVarLower[var]) {
      dVar2 = this->implVarLower[var];
    }
  }
  if (this->implVarUpperSource[var] == sum) {
    dVar3 = this->varUpper[var];
  }
  else {
    dVar3 = this->varUpper[var];
    if (this->implVarUpper[var] <= this->varUpper[var]) {
      dVar3 = this->implVarUpper[var];
    }
  }
  if (coefficient <= 0.0) {
    if (dVar3 < INFINITY) {
      HighsCDouble::operator+=
                ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + sum,dVar3 * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (-INFINITY < dVar2) {
      HighsCDouble::operator+=
                ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (this->varUpper[var] < INFINITY) {
      HighsCDouble::operator+=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,this->varUpper[var] * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    dVar2 = this->varLower[var];
    if (-INFINITY < dVar2) goto LAB_0035daf9;
  }
  else {
    if (-INFINITY < dVar2) {
      HighsCDouble::operator+=
                ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (dVar3 < INFINITY) {
      HighsCDouble::operator+=
                ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start + sum,dVar3 * coefficient);
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    if (-INFINITY < this->varLower[var]) {
      HighsCDouble::operator+=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,this->varLower[var] * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    dVar2 = this->varUpper[var];
    if (dVar2 < INFINITY) {
LAB_0035daf9:
      HighsCDouble::operator+=
                ((this->sumUpperOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
      return;
    }
  }
  piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + sum;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::add(HighsInt sum, HighsInt var, double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}